

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

void __thiscall xercesc_4_0::ElemStack::expandMap(ElemStack *this,StackElem *toExpand)

{
  XMLSize_t XVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  XVar1 = toExpand->fMapCapacity;
  auVar5._8_4_ = (int)(XVar1 >> 0x20);
  auVar5._0_8_ = XVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)XVar1) - 4503599627370496.0)) * 1.25;
  uVar3 = (ulong)dVar6;
  uVar4 = 0x10;
  if (XVar1 != 0) {
    uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 8);
  memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar2),toExpand->fMap,XVar1 << 3);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,toExpand->fMap);
  toExpand->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar2);
  toExpand->fMapCapacity = uVar4;
  return;
}

Assistant:

void ElemStack::expandMap(StackElem* const toExpand)
{
    // For convenience get the old map size
    const XMLSize_t oldCap = toExpand->fMapCapacity;

    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const XMLSize_t  newCapacity = oldCap ?
                                     (XMLSize_t )(oldCap * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    memcpy(newMap, toExpand->fMap, oldCap * sizeof(PrefMapElem));

    // Delete the old map and store the new stuff
    fMemoryManager->deallocate(toExpand->fMap);//delete [] toExpand->fMap;
    toExpand->fMap = newMap;
    toExpand->fMapCapacity = newCapacity;
}